

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O3

QByteArray * __thiscall
QMetaMethodBuilder::returnType(QByteArray *__return_storage_ptr__,QMetaMethodBuilder *this)

{
  Data *pDVar1;
  QMetaMethodBuilderPrivate *pQVar2;
  
  pQVar2 = d_func(this);
  if (pQVar2 == (QMetaMethodBuilderPrivate *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pDVar1 = (pQVar2->returnType).d.d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (pQVar2->returnType).d.ptr;
    (__return_storage_ptr__->d).size = (pQVar2->returnType).d.size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QMetaMethodBuilder::returnType() const
{
    QMetaMethodBuilderPrivate *d = d_func();
    if (d)
        return d->returnType;
    else
        return QByteArray();
}